

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

string * testing::internal::AppendUserMessage
                   (string *__return_storage_ptr__,string *gtest_msg,Message *user_msg)

{
  ulong uVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  undefined4 local_44;
  undefined1 local_40 [8];
  string user_msg_string;
  Message *user_msg_local;
  string *gtest_msg_local;
  
  user_msg_string.field_2._8_8_ = user_msg;
  Message::GetString_abi_cxx11_((string *)local_40,user_msg);
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    std::operator+(&local_68,gtest_msg,"\n");
    std::operator+(__return_storage_ptr__,&local_68,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40);
    std::__cxx11::string::~string((string *)&local_68);
  }
  else {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)gtest_msg);
  }
  local_44 = 1;
  std::__cxx11::string::~string((string *)local_40);
  return __return_storage_ptr__;
}

Assistant:

std::string AppendUserMessage(const std::string& gtest_msg,
                              const Message& user_msg) {
  // Appends the user message if it's non-empty.
  const std::string user_msg_string = user_msg.GetString();
  if (user_msg_string.empty()) {
    return gtest_msg;
  }

  return gtest_msg + "\n" + user_msg_string;
}